

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

bool llvm::DWARFAttribute::mayHaveLocationDescription(Attribute Attr)

{
  uint uVar1;
  bool local_9;
  Attribute Attr_local;
  
  uVar1 = (uint)Attr;
  if (((((((uVar1 == 2) || (uVar1 == 0xb)) || (uVar1 == 0xd)) ||
        ((uVar1 == 0x19 || (uVar1 == 0x22)))) ||
       ((uVar1 == 0x2a || ((uVar1 - 0x2e < 2 || (uVar1 - 0x37 < 2)))))) || (uVar1 == 0x40)) ||
     (((((uVar1 == 0x46 || (uVar1 == 0x48)) || (uVar1 == 0x4a)) ||
       (((uVar1 - 0x4d < 3 || (uVar1 == 0x51)) ||
        ((uVar1 == 0x71 || ((uVar1 - 0x7e < 2 || (uVar1 - 0x83 < 4)))))))) ||
      ((uVar1 == 0x2111 || (uVar1 == 0x2113)))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool DWARFAttribute::mayHaveLocationDescription(dwarf::Attribute Attr) {
  switch (Attr) {
  // From the DWARF v5 specification.
  case DW_AT_location:
  case DW_AT_byte_size:
  case DW_AT_bit_size:
  case DW_AT_string_length:
  case DW_AT_lower_bound:
  case DW_AT_return_addr:
  case DW_AT_bit_stride:
  case DW_AT_upper_bound:
  case DW_AT_count:
  case DW_AT_data_member_location:
  case DW_AT_frame_base:
  case DW_AT_segment:
  case DW_AT_static_link:
  case DW_AT_use_location:
  case DW_AT_vtable_elem_location:
  case DW_AT_allocated:
  case DW_AT_associated:
  case DW_AT_byte_stride:
  case DW_AT_rank:
  case DW_AT_call_value:
  case DW_AT_call_origin:
  case DW_AT_call_target:
  case DW_AT_call_target_clobbered:
  case DW_AT_call_data_location:
  case DW_AT_call_data_value:
  // Extensions.
  case DW_AT_GNU_call_site_value:
  case DW_AT_GNU_call_site_target:
    return true;
  default:
    return false;
  }
}